

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

Ray * GetScreenToWorldRayEx
                (Ray *__return_storage_ptr__,Vector2 position,Camera camera,int width,int height)

{
  double dVar1;
  Matrix projection;
  Matrix projection_00;
  Matrix projection_01;
  Matrix view;
  Matrix view_00;
  Matrix view_01;
  double dVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vector3 VVar19;
  Vector3 VVar20;
  Vector3 VVar21;
  Matrix result_1;
  Matrix matView;
  undefined8 local_158;
  float local_148;
  float fStack_140;
  float fStack_13c;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 uStack_120;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  undefined8 local_e8;
  undefined8 local_c8;
  ulong uStack_c0;
  undefined8 local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  ulong uStack_a0;
  
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->position).z = 0;
  (__return_storage_ptr__->direction).y = 0.0;
  (__return_storage_ptr__->direction).z = 0.0;
  fVar5 = camera.position.x;
  fVar12 = camera.position.y;
  fVar15 = fVar5 - camera.target.x;
  fVar16 = fVar12 - camera.target.y;
  fVar17 = camera.position.z - camera.target.z;
  fVar4 = fVar17 * fVar17 + fVar15 * fVar15 + fVar16 * fVar16;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = (float)(-(uint)(fVar4 == 0.0) & 0x3f800000 | ~-(uint)(fVar4 == 0.0) & (uint)(1.0 / fVar4))
  ;
  fVar15 = fVar15 * fVar4;
  fVar16 = fVar16 * fVar4;
  fVar17 = fVar17 * fVar4;
  fVar18 = camera.up.y * fVar17 - camera.up.z * fVar16;
  fVar11 = camera.up.z * fVar15 - fVar17 * camera.up.x;
  fVar9 = camera.up.x * fVar16 - fVar15 * camera.up.y;
  fVar4 = fVar9 * fVar9 + fVar18 * fVar18 + fVar11 * fVar11;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  dVar3 = rlCullDistanceFar;
  dVar2 = rlCullDistanceNear;
  uVar13 = 0x3f800000;
  fVar14 = 1.0 - (position.y + position.y) / (float)height;
  uVar7 = 0;
  fVar4 = (float)(-(uint)(fVar4 == 0.0) & 0x3f800000 | ~-(uint)(fVar4 == 0.0) & (uint)(1.0 / fVar4))
  ;
  fVar18 = fVar18 * fVar4;
  fVar11 = fVar11 * fVar4;
  fVar4 = fVar4 * fVar9;
  fVar9 = fVar16 * fVar4 - fVar11 * fVar17;
  fVar10 = fVar17 * fVar18 - fVar4 * fVar15;
  fVar8 = fVar15 * fVar11 + -fVar16 * fVar18;
  uStack_c0 = CONCAT44(fVar4 * camera.position.z + fVar18 * fVar5 + fVar11 * fVar12,fVar4) ^
              0x8000000000000000;
  uStack_b0 = CONCAT44(fVar8 * camera.position.z + fVar9 * fVar5 + fVar10 * fVar12,fVar8) ^
              0x8000000000000000;
  fVar4 = (position.x + position.x) / (float)width + -1.0;
  uStack_a0 = CONCAT44(fVar17 * camera.position.z + fVar15 * fVar5 + fVar12 * fVar16,fVar17) ^
              0x8000000000000000;
  fStack_140 = 0.0;
  fStack_13c = 0.0;
  fStack_130 = 0.0;
  fStack_12c = 0.0;
  local_148 = 1.0;
  fStack_134 = 1.0;
  uStack_120 = 0x3f800000;
  uStack_110 = 0x3f80000000000000;
  if (camera.projection == 1) {
    fVar5 = camera.fovy * 0.5;
    fVar12 = ((float)width / (float)height) * fVar5;
    local_148 = 2.0 / (fVar12 + fVar12);
    fStack_134 = 2.0 / (fVar5 + fVar5);
    fStack_13c = -(fVar12 - fVar12) / (fVar12 + fVar12);
    fStack_12c = -(fVar5 - fVar5) / (fVar5 + fVar5);
    fStack_140 = 0.0;
    fStack_130 = 0.0;
    uStack_120 = 0xbf8000a8bb0312c5;
  }
  else {
    if (camera.projection != 0) goto LAB_00174545;
    dVar6 = tan((double)(camera.fovy * 0.017453292) * 0.5);
    dVar6 = dVar6 * dVar2;
    dVar1 = ((double)width / (double)height) * dVar6;
    fVar12 = (float)dVar3;
    fVar17 = (float)(dVar3 - dVar2);
    fVar5 = (float)dVar2;
    local_148 = (fVar5 + fVar5) / (float)(dVar1 + dVar1);
    fStack_134 = (fVar5 + fVar5) / (float)(dVar6 + dVar6);
    fStack_140 = ((float)dVar1 - (float)dVar1) / (float)(dVar1 + dVar1);
    fStack_130 = ((float)dVar6 - (float)dVar6) / (float)(dVar6 + dVar6);
    fStack_13c = 0.0;
    fStack_12c = 0.0;
    uStack_120 = CONCAT44((fVar5 * fVar12 * -2.0) / fVar17,-(fVar5 + fVar12) / fVar17);
    uVar13 = 0;
    uVar7 = 0xbf800000;
  }
  uStack_110 = CONCAT44(uVar13,uVar7);
LAB_00174545:
  projection.m4 = 0.0;
  projection.m0 = local_148;
  projection.m12 = fStack_13c;
  projection.m8 = fStack_140;
  projection.m13 = fStack_12c;
  projection.m9 = fStack_130;
  VVar19.y = fVar14;
  VVar19.x = fVar4;
  projection.m1 = (float)(int)((ulong)(uint)fStack_134 << 0x20);
  projection.m5 = (float)(int)(((ulong)(uint)fStack_134 << 0x20) >> 0x20);
  projection.m2 = 0.0;
  projection.m6 = 0.0;
  projection.m10 = (float)(undefined4)uStack_120;
  projection.m14 = (float)uStack_120._4_4_;
  projection.m3 = 0.0;
  projection.m7 = 0.0;
  projection.m11 = (float)(undefined4)uStack_110;
  projection.m15 = (float)uStack_110._4_4_;
  view.m8 = (float)(undefined4)uStack_c0;
  view.m12 = (float)uStack_c0._4_4_;
  view.m0 = fVar18;
  view.m4 = fVar11;
  view.m1 = fVar9;
  view.m5 = fVar10;
  view.m9 = (float)(undefined4)uStack_b0;
  view.m13 = (float)uStack_b0._4_4_;
  view.m2 = fVar15;
  view.m6 = fVar16;
  view.m10 = (float)(undefined4)uStack_a0;
  view.m14 = (float)uStack_a0._4_4_;
  view.m3 = 0.0;
  view.m7 = 0.0;
  view.m11 = 0.0;
  view.m15 = 1.0;
  VVar19.z = 0.0;
  VVar19 = Vector3Unproject(VVar19,projection,view);
  projection_00.m4 = 0.0;
  projection_00.m0 = local_148;
  projection_00.m12 = fStack_13c;
  projection_00.m8 = fStack_140;
  projection_00.m13 = fStack_12c;
  projection_00.m9 = fStack_130;
  projection_00.m1 = (float)(int)((ulong)(uint)fStack_134 << 0x20);
  projection_00.m5 = (float)(int)(((ulong)(uint)fStack_134 << 0x20) >> 0x20);
  projection_00.m2 = 0.0;
  projection_00.m6 = 0.0;
  projection_00.m10 = (float)(undefined4)uStack_120;
  projection_00.m14 = (float)uStack_120._4_4_;
  projection_00.m3 = 0.0;
  projection_00.m7 = 0.0;
  projection_00.m11 = (float)(undefined4)uStack_110;
  projection_00.m15 = (float)uStack_110._4_4_;
  view_00.m8 = (float)(undefined4)uStack_c0;
  view_00.m12 = (float)uStack_c0._4_4_;
  view_00.m0 = fVar18;
  view_00.m4 = fVar11;
  view_00.m1 = fVar9;
  view_00.m5 = fVar10;
  view_00.m9 = (float)(undefined4)uStack_b0;
  view_00.m13 = (float)uStack_b0._4_4_;
  view_00.m2 = fVar15;
  view_00.m6 = fVar16;
  view_00.m10 = (float)(undefined4)uStack_a0;
  view_00.m14 = (float)uStack_a0._4_4_;
  view_00.m3 = 0.0;
  view_00.m7 = 0.0;
  view_00.m11 = 0.0;
  view_00.m15 = 1.0;
  VVar20.z = 1.0;
  VVar20.x = fVar4;
  VVar20.y = fVar14;
  VVar20 = Vector3Unproject(VVar20,projection_00,view_00);
  projection_01.m4 = 0.0;
  projection_01.m0 = local_148;
  projection_01.m12 = fStack_13c;
  projection_01.m8 = fStack_140;
  projection_01.m13 = fStack_12c;
  projection_01.m9 = fStack_130;
  projection_01.m1 = (float)(int)((ulong)(uint)fStack_134 << 0x20);
  projection_01.m5 = (float)(int)(((ulong)(uint)fStack_134 << 0x20) >> 0x20);
  projection_01.m2 = 0.0;
  projection_01.m6 = 0.0;
  projection_01.m10 = (float)(undefined4)uStack_120;
  projection_01.m14 = (float)uStack_120._4_4_;
  projection_01.m3 = 0.0;
  projection_01.m7 = 0.0;
  projection_01.m11 = (float)(undefined4)uStack_110;
  projection_01.m15 = (float)uStack_110._4_4_;
  view_01.m8 = (float)(undefined4)uStack_c0;
  view_01.m12 = (float)uStack_c0._4_4_;
  view_01.m0 = fVar18;
  view_01.m4 = fVar11;
  view_01.m1 = fVar9;
  view_01.m5 = fVar10;
  view_01.m9 = (float)(undefined4)uStack_b0;
  view_01.m13 = (float)uStack_b0._4_4_;
  view_01.m2 = fVar15;
  view_01.m6 = fVar16;
  view_01.m10 = (float)(undefined4)uStack_a0;
  view_01.m14 = (float)uStack_a0._4_4_;
  view_01.m3 = 0.0;
  view_01.m7 = 0.0;
  view_01.m11 = 0.0;
  view_01.m15 = 1.0;
  VVar21.z = -1.0;
  VVar21.x = fVar4;
  VVar21.y = fVar14;
  VVar21 = Vector3Unproject(VVar21,projection_01,view_01);
  local_e8._0_4_ = VVar20.x;
  local_e8._4_4_ = VVar20.y;
  local_108 = VVar19.x;
  fStack_104 = VVar19.y;
  local_e8._0_4_ = (float)local_e8 - local_108;
  local_e8._4_4_ = local_e8._4_4_ - fStack_104;
  fVar5 = VVar20.z - VVar19.z;
  fVar4 = fVar5 * fVar5 + (float)local_e8 * (float)local_e8 + local_e8._4_4_ * local_e8._4_4_;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar4 = 1.0 / fVar4;
    local_e8 = CONCAT44(local_e8._4_4_ * fVar4,(float)local_e8 * fVar4);
    fVar5 = fVar5 * fVar4;
  }
  if (camera.projection == 1) {
    (__return_storage_ptr__->position).x = (float)(int)VVar21._0_8_;
    (__return_storage_ptr__->position).y = (float)(int)((ulong)VVar21._0_8_ >> 0x20);
    (__return_storage_ptr__->position).z = VVar21.z;
  }
  else if (camera.projection == 0) {
    (__return_storage_ptr__->position).z = camera.position.z;
    (__return_storage_ptr__->position).x = camera.position.x;
    (__return_storage_ptr__->position).y = camera.position.y;
  }
  (__return_storage_ptr__->direction).x = (float)(int)local_e8;
  (__return_storage_ptr__->direction).y = (float)(int)((ulong)local_e8 >> 0x20);
  (__return_storage_ptr__->direction).z = fVar5;
  return __return_storage_ptr__;
}

Assistant:

Ray GetScreenToWorldRayEx(Vector2 position, Camera camera, int width, int height)
{
    Ray ray = { 0 };

    // Calculate normalized device coordinates
    // NOTE: y value is negative
    float x = (2.0f*position.x)/(float)width - 1.0f;
    float y = 1.0f - (2.0f*position.y)/(float)height;
    float z = 1.0f;

    // Store values in a vector
    Vector3 deviceCoords = { x, y, z };

    // Calculate view matrix from camera look at
    Matrix matView = MatrixLookAt(camera.position, camera.target, camera.up);

    Matrix matProj = MatrixIdentity();

    if (camera.projection == CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        matProj = MatrixPerspective(camera.fovy*DEG2RAD, ((double)width/(double)height), rlGetCullDistanceNear(), rlGetCullDistanceFar());
    }
    else if (camera.projection == CAMERA_ORTHOGRAPHIC)
    {
        double aspect = (double)width/(double)height;
        double top = camera.fovy/2.0;
        double right = top*aspect;

        // Calculate projection matrix from orthographic
        matProj = MatrixOrtho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Unproject far/near points
    Vector3 nearPoint = Vector3Unproject((Vector3){ deviceCoords.x, deviceCoords.y, 0.0f }, matProj, matView);
    Vector3 farPoint = Vector3Unproject((Vector3){ deviceCoords.x, deviceCoords.y, 1.0f }, matProj, matView);

    // Unproject the mouse cursor in the near plane
    // We need this as the source position because orthographic projects,
    // compared to perspective doesn't have a convergence point,
    // meaning that the "eye" of the camera is more like a plane than a point
    Vector3 cameraPlanePointerPos = Vector3Unproject((Vector3){ deviceCoords.x, deviceCoords.y, -1.0f }, matProj, matView);

    // Calculate normalized direction vector
    Vector3 direction = Vector3Normalize(Vector3Subtract(farPoint, nearPoint));

    if (camera.projection == CAMERA_PERSPECTIVE) ray.position = camera.position;
    else if (camera.projection == CAMERA_ORTHOGRAPHIC) ray.position = cameraPlanePointerPos;

    // Apply calculated vectors to ray
    ray.direction = direction;

    return ray;
}